

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray-bmp.hxx
# Opt level: O0

void andres::bmp::save<unsigned_char>
               (ostream *stream,Marray<unsigned_char,_std::allocator<unsigned_long>_> *in)

{
  uint uVar1;
  size_t sVar2;
  runtime_error *prVar3;
  CoordinateOrder *pCVar4;
  size_t *begin;
  size_t *end;
  size_t sVar5;
  uint8_t *puVar6;
  ostream *poVar7;
  reference puVar8;
  ulong local_e0;
  size_t j;
  uint8_t color;
  uint32_t stride;
  uint32_t paddingSize;
  uint32_t uStack_c4;
  uint8_t padding [3];
  uint32_t widthInBytes;
  uint32_t height;
  uint32_t width;
  uint32_t BYTES_PER_PIXEL;
  allocator<unsigned_char> local_72;
  uchar local_71;
  undefined1 local_70 [8];
  Marray<unsigned_char,_std::allocator<unsigned_long>_> tmp;
  Marray<unsigned_char,_std::allocator<unsigned_long>_> *in_local;
  ostream *stream_local;
  
  sVar2 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension
                    (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>);
  if (sVar2 != 2) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar3,"not implemented for Marray of dimension other than 2.");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar2 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape
                    (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>,0);
  uVar1 = std::numeric_limits<unsigned_int>::max();
  if (sVar2 <= uVar1) {
    sVar2 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape
                      (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>,1);
    uVar1 = std::numeric_limits<unsigned_int>::max();
    if (sVar2 <= uVar1) {
      pCVar4 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::coordinateOrder
                         (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>);
      if (*pCVar4 == FirstMajorOrder) {
        begin = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shapeBegin
                          (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>);
        end = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shapeEnd
                        (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>);
        local_71 = '\x01';
        std::allocator<unsigned_char>::allocator(&local_72);
        Marray<unsigned_char,std::allocator<unsigned_long>>::Marray<unsigned_long_const*>
                  ((Marray<unsigned_char,std::allocator<unsigned_long>> *)local_70,begin,end,
                   &local_71,&defaultOrder,&local_72);
        std::allocator<unsigned_char>::~allocator(&local_72);
        View<unsigned_char,_false,_std::allocator<unsigned_long>_>::View
                  ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)&width,
                   (View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)local_70);
        View<unsigned_char,_false,_std::allocator<unsigned_long>_>::operator=
                  ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)&width,
                   &in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>);
        View<unsigned_char,_false,_std::allocator<unsigned_long>_>::~View
                  ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)&width);
        pCVar4 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::coordinateOrder
                           ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)local_70);
        if (*pCVar4 != LastMajorOrder) {
          __assert_fail("tmp.coordinateOrder() == LastMajorOrder",
                        "/workspace/llm4binary/github/license_c_cmakelists/bjoern-andres[P]marray/include/andres/marray-bmp.hxx"
                        ,0x6b,"void andres::bmp::save(std::ostream &, const Marray<std::uint8_t> &)"
                       );
        }
        save<unsigned_char>(stream,(Marray<unsigned_char,_std::allocator<unsigned_long>_> *)local_70
                           );
        Marray<unsigned_char,_std::allocator<unsigned_long>_>::~Marray
                  ((Marray<unsigned_char,_std::allocator<unsigned_long>_> *)local_70);
      }
      else {
        pCVar4 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::coordinateOrder
                           (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>);
        if (*pCVar4 != LastMajorOrder) {
          __assert_fail("in.coordinateOrder() == LastMajorOrder",
                        "/workspace/llm4binary/github/license_c_cmakelists/bjoern-andres[P]marray/include/andres/marray-bmp.hxx"
                        ,0x70,"void andres::bmp::save(std::ostream &, const Marray<std::uint8_t> &)"
                       );
        }
        sVar2 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape
                          (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>,0);
        sVar5 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape
                          (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>,1);
        uStack_c4 = (uint32_t)sVar5;
        paddingSize = (uint32_t)sVar2;
        memset((void *)((long)&stride + 1),0,3);
        puVar6 = fileHeader(uStack_c4,paddingSize + (4 - (paddingSize & 3) & 3));
        std::ostream::write((char *)stream,(long)puVar6);
        puVar6 = infoHeader((uint32_t)sVar2,uStack_c4,8);
        std::ostream::write((char *)stream,(long)puVar6);
        j._3_1_ = '\0';
        while( true ) {
          poVar7 = std::operator<<(stream,j._3_1_);
          poVar7 = std::operator<<(poVar7,j._3_1_);
          poVar7 = std::operator<<(poVar7,j._3_1_);
          std::ostream::operator<<((ostream *)poVar7,0);
          if (j._3_1_ == 0xff) break;
          j._3_1_ = j._3_1_ + '\x01';
        }
        for (local_e0 = 0; local_e0 < uStack_c4; local_e0 = local_e0 + 1) {
          puVar8 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                             ((View<unsigned_char,false,std::allocator<unsigned_long>> *)in,0,
                              (uStack_c4 - local_e0) - 1);
          std::ostream::write((char *)stream,(long)puVar8);
          std::ostream::write((char *)stream,(long)&stride + 1);
        }
      }
      return;
    }
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,"marray is too large for export to BMP");
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
save(
    std::ostream & stream,
    Marray<std::uint8_t> const & in
) {
    if(in.dimension() != 2) {
        throw std::runtime_error("not implemented for Marray of dimension other than 2.");
    }
    if(in.shape(0) > std::numeric_limits<std::uint32_t>::max()
    || in.shape(1) > std::numeric_limits<std::uint32_t>::max()) {
        throw std::runtime_error("marray is too large for export to BMP");
    }
    if(in.coordinateOrder() == FirstMajorOrder) {
        Marray<unsigned char> tmp(in.shapeBegin(), in.shapeEnd(), LastMajorOrder);
        // note: tmp = in; would change in.coordinateOrder() which we do not want. thus:
        static_cast<andres::View<unsigned char, false> >(tmp) = in; // re-order in memory
        assert(tmp.coordinateOrder() == LastMajorOrder);
        save(stream, tmp); // recurse!
        return;
    }

    assert(in.coordinateOrder() == LastMajorOrder);

    std::uint32_t const BYTES_PER_PIXEL = 1;
    std::uint32_t const width = static_cast<std::uint32_t>(in.shape(0));
    std::uint32_t const height = static_cast<std::uint32_t>(in.shape(1));
    std::uint32_t const widthInBytes = width * BYTES_PER_PIXEL;
    std::uint8_t const padding[3] = {0, 0, 0};
    std::uint32_t const paddingSize = (4 - (widthInBytes) % 4) % 4;
    std::uint32_t const stride = widthInBytes + paddingSize;

    stream.write(reinterpret_cast<char const *>(fileHeader(height, stride)), FILE_HEADER_SIZE);
    stream.write(reinterpret_cast<char const *>(infoHeader(width, height, BYTES_PER_PIXEL * 8)), INFO_HEADER_SIZE);

    // write color palette (required by BMP format for <= 8 bits per pixel)
    for(std::uint8_t color = 0; true; ++color) {
        stream << color << color << color << 0; // RGBA32
        if(color == 255) {
            break;
        }
    }

    // write image
    for(size_t j = 0; j < height; ++j) {
        stream.write(reinterpret_cast<char const *>(&in(0, height - j - 1)), width);
        stream.write(reinterpret_cast<char const *>(padding), paddingSize);
    }
}